

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_seek(PHYSFS_File *handle,PHYSFS_uint64 pos)

{
  int iVar1;
  int iVar2;
  PHYSFS_sint64 PVar3;
  void *pvVar4;
  ulong uVar5;
  
  iVar2 = 1;
  if (handle->opaque != (void *)0x0) {
    iVar1 = PHYSFS_flush(handle);
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      if ((handle[3].opaque == (void *)0x0) || (*(char *)&handle[1].opaque == '\0')) {
LAB_00109ced:
        handle[5].opaque = (void *)0x0;
        handle[6].opaque = (void *)0x0;
        iVar2 = (**(code **)((long)handle->opaque + 0x20))(handle->opaque,pos);
        return iVar2;
      }
      PVar3 = PHYSFS_tell(handle);
      uVar5 = pos - PVar3;
      if ((long)uVar5 < 0) {
        pvVar4 = handle[6].opaque;
        if (pvVar4 < (void *)-uVar5) goto LAB_00109ced;
      }
      else {
        pvVar4 = handle[6].opaque;
        if ((ulong)((long)handle[5].opaque - (long)pvVar4) < uVar5) goto LAB_00109ced;
      }
      handle[6].opaque = (void *)((long)pvVar4 + uVar5);
    }
  }
  return iVar2;
}

Assistant:

int PHYSFS_seek(PHYSFS_File *handle, PHYSFS_uint64 pos)
{
    FileHandle *fh = (FileHandle *) handle;
    if (fh->io == NULL) /* magic stream file; seeks are NOPs */
        return 1;

    BAIL_IF_ERRPASS(!PHYSFS_flush(handle), 0);

    if (fh->buffer && fh->forReading)
    {
        /* avoid throwing away our precious buffer if seeking within it. */
        PHYSFS_sint64 offset = pos - PHYSFS_tell(handle);
        if ( /* seeking within the already-buffered range? */
             /* forward? */
            ((offset >= 0) && (((size_t)offset) <= fh->buffill-fh->bufpos)) ||
            /* backward? */
            ((offset < 0) && (((size_t) -offset) <= fh->bufpos)) )
        {
            fh->bufpos = (size_t) (((PHYSFS_sint64) fh->bufpos) + offset);
            return 1; /* successful seek */
        } /* if */
    } /* if */

    /* we have to fall back to a 'raw' seek. */
    fh->buffill = fh->bufpos = 0;
    return fh->io->seek(fh->io, pos);
}